

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

void __thiscall tl::StrT<char>::resizeNoCopy(StrT<char> *this,u32 size)

{
  char *pcVar1;
  char *pcVar2;
  
  if (size != 0) {
    pcVar2 = growIfNeeded(this,size);
    if (pcVar2 != (char *)0x0) {
      pcVar1 = this->_str;
      if (pcVar1 != (char *)0x0 && pcVar1 != &s_emptyStr<char>) {
        operator_delete__(pcVar1);
      }
      this->_str = pcVar2;
    }
    this->_size = size;
    this->_str[size] = '\0';
  }
  return;
}

Assistant:

void StrT<CharT>::resizeNoCopy(u32 size)
{
    if(size == 0)
        return;
    if(auto str = growIfNeeded(size)) {
        if(_str != s_emptyStr<CharT>) {
            delete[] _str;
        }
        _str = str;
    }
    _size = size;
    _str[size] = 0;
}